

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O2

void character_data_handler(void *data,char *s,int len)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  size_t __n;
  
  if ((*(int *)((long)data + 0x428) == 0) &&
     (*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) != 0)) {
    iVar1 = is_whitespace(s,len);
    if (iVar1 == 0) {
      coda_set_error(-300,"non-whitespace character data not allowed for element \'%s\'",
                     *(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 800));
      goto LAB_00160ea1;
    }
  }
  lVar2 = *(long *)((long)data + 0x430);
  __ptr = *(void **)((long)data + 0x440);
  __n = (size_t)len;
  if (*(long *)((long)data + 0x438) < (long)(lVar2 + __n)) {
    __ptr = realloc(__ptr,lVar2 + __n);
    if (__ptr == (void *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %ld bytes) (%s:%u)",
                     __n + *(long *)((long)data + 0x430),
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                     ,0x2e4);
LAB_00160ea1:
      abort_parser((parser_info_conflict *)data);
      return;
    }
    *(void **)((long)data + 0x440) = __ptr;
    lVar2 = *(long *)((long)data + 0x430);
    *(size_t *)((long)data + 0x438) = lVar2 + __n;
  }
  memcpy((void *)(lVar2 + (long)__ptr),s,__n);
  *(long *)((long)data + 0x430) = *(long *)((long)data + 0x430) + __n;
  return;
}

Assistant:

static void XMLCALL character_data_handler(void *data, const char *s, int len)
{
    parser_info *info = (parser_info *)data;

    if (!info->update_definition && info->record[info->depth] != NULL && !is_whitespace(s, len))
    {
        coda_set_error(CODA_ERROR_PRODUCT, "non-whitespace character data not allowed for element '%s'",
                       info->xml_name[info->depth]);
        abort_parser(info);
        return;
    }

    /* add character data to our string value */
    if (info->value_length + len > info->value_size)
    {
        char *new_value;

        new_value = realloc(info->value, info->value_length + len);
        if (new_value == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %ld bytes) (%s:%u)",
                           info->value_length + len, __FILE__, __LINE__);
            abort_parser(info);
            return;
        }
        info->value = new_value;
        info->value_size = info->value_length + len;
    }
    memcpy(&info->value[info->value_length], s, len);
    info->value_length += len;
}